

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

void __thiscall
wallet::coinselector_tests::coin_grinder_tests::test_method(coin_grinder_tests *this)

{
  pointer pcVar1;
  bool bVar2;
  size_type sVar3;
  T *pTVar4;
  size_t sVar5;
  iterator pvVar6;
  unsigned_long *puVar7;
  _Any_data *p_Var8;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  CAmount target_2;
  size_t expected_attempts_1;
  CAmount target;
  CoinSelectionParams dummy_params;
  FastRandomContext rand;
  NodeContext *m_node;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  _Any_data local_5c8;
  code *local_5b8;
  code *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  char *local_478;
  char *local_470;
  size_t local_468;
  assertion_result local_460;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  char *local_3d0;
  char *local_3c8;
  unsigned_long local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  _Any_data local_368;
  code *local_358;
  code *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  code *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  size_t local_248;
  CoinSelectionParams local_240;
  string local_1e8;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_198;
  bool local_180;
  bool local_178;
  int local_168;
  CAmount local_160;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_148;
  _Variant_storage<false,_bilingual_str,_wallet::SelectionResult> local_138;
  FastRandomContext local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_c0,false);
  local_240.change_output_size = 0x22;
  local_240.change_spend_size = 0x44;
  local_240.m_min_change_target = 1000000;
  local_240.min_viable_change = 0;
  local_240.m_change_fee = 0;
  local_240.m_cost_of_change = 0;
  local_240.m_effective_feerate.nSatoshisPerK = 5000;
  local_240.m_long_term_feerate.nSatoshisPerK = 2000;
  local_240.m_discard_feerate.nSatoshisPerK = 1000;
  local_240.tx_noinputs_size = 0x2c;
  local_240.m_subtract_fee_outputs = false;
  local_240.m_avoid_partial_spends = false;
  local_240.m_include_unsafe_inputs = false;
  local_240.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  local_248 = 4950000000;
  m_node = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node;
  p_Var8 = &local_268;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_250 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1139:91)>
              ::_M_invoke;
  local_258 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1139:91)>
              ::_M_manager;
  pvVar6 = (iterator)0x2710;
  local_240.rng_fast = &local_c0;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_248,&local_240,m_node,
              10000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,__destroy_functor);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x47b;
  file.m_begin = (iterator)&local_278;
  msg.m_end = (iterator)p_Var8;
  msg.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_288,msg);
  local_158[0] = local_138._M_index != '\x01';
  local_158._8_8_ = (element_type *)0x0;
  aStack_148._M_allocated_capacity = 0;
  local_1c8._24_8_ = &local_1e8;
  local_1e8._M_dataplus._M_p = "!res";
  local_1e8._M_string_length = 0xf8108e;
  local_1c8._8_4_ = local_1c8._8_4_ & 0xffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_290 = "";
  pvVar6 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)m_node,
             (size_t)&local_298,0x47b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_148._M_allocated_capacity);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x47c;
  file_00.m_begin = (iterator)&local_2a8;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2b8,
             msg_00);
  util::ErrorString<wallet::SelectionResult>
            ((bilingual_str *)local_1c8,(Result<wallet::SelectionResult> *)&local_138);
  local_1e8._M_dataplus._M_p._0_1_ = CONCAT44(local_1c8._12_4_,local_1c8._8_4_) == 0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_460._0_8_ = "util::ErrorString(res).empty()";
  local_460.m_message.px = (element_type *)0xf810ad;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2c0 = "";
  aStack_148._8_8_ = &local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_158,1,0,WARN,(check_type)m_node,
             (size_t)&local_2c8,0x47c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &aStack_198) {
    operator_delete(local_1a8._M_p,aStack_198._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  local_248 = 2950000000;
  p_Var8 = &local_2e8;
  local_2e8._M_unused._M_object = (void *)0x0;
  local_2e8._8_8_ = 0;
  local_2d0 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1157:91)>
              ::_M_invoke;
  local_2d8 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1157:91)>
              ::_M_manager;
  pvVar6 = (iterator)0xbb8;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_248,&local_240,m_node,
              3000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_2d8 != (code *)0x0) {
    (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x48d;
  file_01.m_begin = (iterator)&local_2f8;
  msg_01.m_end = (iterator)p_Var8;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  local_158[0] = local_138._M_index != '\x01';
  local_158._8_8_ = (element_type *)0x0;
  aStack_148._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = "!res";
  local_1e8._M_string_length = 0xf8108e;
  local_1c8._8_4_ = local_1c8._8_4_ & 0xffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_310 = "";
  pvVar6 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_1c8._24_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)m_node,
             (size_t)&local_318,0x48d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_148._M_allocated_capacity);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x48e;
  file_02.m_begin = (iterator)&local_328;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  util::ErrorString<wallet::SelectionResult>
            ((bilingual_str *)local_1c8,(Result<wallet::SelectionResult> *)&local_138);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     "The inputs size exceeds the maximum weight",0,0x2a);
  local_1e8._M_dataplus._M_p._0_1_ = sVar3 != 0xffffffffffffffff;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_460._0_8_ =
       "util::ErrorString(res).original.find(\"The inputs size exceeds the maximum weight\") != std::string::npos"
  ;
  local_460.m_message.px = (element_type *)0xf81115;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_340 = "";
  aStack_148._8_8_ = &local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_158,1,0,WARN,(check_type)m_node,
             (size_t)&local_348,0x48e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &aStack_198) {
    operator_delete(local_1a8._M_p,aStack_198._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  local_460._0_8_ = (char *)0x96fa8340;
  p_Var8 = &local_368;
  local_368._M_unused._M_object = (void *)0x0;
  local_368._8_8_ = 0;
  local_350 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1175:91)>
              ::_M_invoke;
  local_358 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1175:91)>
              ::_M_manager;
  pvVar6 = (iterator)0x2710;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_460,&local_240,m_node,
              10000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,__destroy_functor);
  }
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4a1;
  file_03.m_begin = (iterator)&local_378;
  msg_03.m_end = (iterator)p_Var8;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_388,
             msg_03);
  local_158[0] = local_138._M_index == '\x01';
  local_158._8_8_ = (element_type *)0x0;
  aStack_148._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = "res";
  local_1e8._M_string_length = 0xf8108e;
  local_1c8._8_4_ = local_1c8._8_4_ & 0xffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_390 = "";
  puVar7 = (unsigned_long *)0x1;
  pvVar6 = (iterator)0x0;
  local_1c8._24_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)m_node,
             (size_t)&local_398,0x4a1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_148._M_allocated_capacity);
  local_248 = 0x25;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4a4;
  file_04.m_begin = (iterator)&local_3a8;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = (iterator)puVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3b8,
             msg_04);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  sVar5 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  local_1e8._M_dataplus._M_p._0_1_ = sVar5 == local_248;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  local_3c0 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  tinyformat::format<unsigned_long,unsigned_long>
            ((string *)local_158,(tinyformat *)"Expected %i attempts, but got %i",(char *)&local_248
             ,&local_3c0,puVar7);
  local_1c8._8_4_ = local_1c8._8_4_ & 0xffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013aba30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3c8 = "";
  local_1c8._24_8_ = (string *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_1c8,1,1,WARN,(check_type)m_node,
             (size_t)&local_3d0,0x4a4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ != &aStack_148) {
    operator_delete((void *)local_158._0_8_,(ulong)(aStack_148._M_allocated_capacity + 1));
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  local_248 = 190000000;
  p_Var8 = &local_3f8;
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e0 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1197:91)>
              ::_M_invoke;
  local_3e8 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1197:91)>
              ::_M_manager;
  pvVar6 = (iterator)0x61a80;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_248,&local_240,m_node,
              400000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  pcVar1 = local_1c8 + 8;
  local_1c8._8_4_ = _S_red;
  local_1c8._16_8_ = 0;
  local_1a0 = 0;
  aStack_198._M_allocated_capacity = 0;
  aStack_198._8_2_ = 3;
  local_180 = false;
  local_178 = true;
  local_168 = 0;
  local_160 = 0;
  local_158._0_8_ = (_func_int **)0x5f5e100;
  local_1c8._24_8_ = pcVar1;
  local_1a8._M_p = pcVar1;
  add_coin((CAmount *)local_158,1,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0x5f5e100;
  add_coin((CAmount *)local_158,2,(SelectionResult *)local_1c8);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4b7;
  file_05.m_begin = (iterator)&local_408;
  msg_05.m_end = (iterator)p_Var8;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_418,
             msg_05);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  bVar2 = EquivalentResult((SelectionResult *)local_1c8,pTVar4);
  local_1e8._M_dataplus._M_p._0_1_ = bVar2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_460._0_8_ = "EquivalentResult(expected_result, *res)";
  local_460.m_message.px = (element_type *)0xf80603;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_420 = "";
  puVar7 = (unsigned_long *)0x1;
  pvVar6 = (iterator)0x0;
  aStack_148._8_8_ = &local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_158,1,0,WARN,(check_type)m_node,
             (size_t)&local_428,0x4b7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  local_3c0 = 3;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4ba;
  file_06.m_begin = (iterator)&local_438;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = (iterator)puVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_448,
             msg_06);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  sVar5 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar5 == local_3c0);
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  local_468 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  tinyformat::format<unsigned_long,unsigned_long>
            (&local_1e8,(tinyformat *)"Expected %i attempts, but got %i",(char *)&local_3c0,
             &local_468,puVar7);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013aba30;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_470 = "";
  aStack_148._8_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_158,1,1,WARN,(check_type)m_node,(size_t)&local_478,
             0x4ba);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_1c8);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  local_248 = 3000000000;
  p_Var8 = &local_498;
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_480 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1219:91)>
              ::_M_invoke;
  local_488 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1219:91)>
              ::_M_manager;
  pvVar6 = (iterator)0x61a80;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_248,&local_240,m_node,
              400000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,__destroy_functor);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4cf;
  file_07.m_begin = (iterator)&local_4a8;
  msg_07.m_end = (iterator)p_Var8;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4b8,
             msg_07);
  local_158[0] = local_138._M_index == '\x01';
  local_158._8_8_ = (element_type *)0x0;
  aStack_148._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = "res";
  local_1e8._M_string_length = 0xf8108e;
  local_1c8._8_4_ = local_1c8._8_4_ & 0xffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4c0 = "";
  pvVar6 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_1c8._24_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)m_node,
             (size_t)&local_4c8,0x4cf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_148._M_allocated_capacity);
  local_1c8._8_4_ = _S_red;
  local_1c8._16_8_ = 0;
  local_1a0 = 0;
  aStack_198._M_allocated_capacity = 0;
  aStack_198._8_2_ = 3;
  local_180 = false;
  local_178 = true;
  local_168 = 0;
  local_160 = 0;
  local_158._0_8_ = (_func_int **)0x53724e00;
  local_1c8._24_8_ = pcVar1;
  local_1a8._M_p = pcVar1;
  add_coin((CAmount *)local_158,1,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0x4d7c6d00;
  add_coin((CAmount *)local_158,2,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0x17d78400;
  add_coin((CAmount *)local_158,3,(SelectionResult *)local_1c8);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x4d4;
  file_08.m_begin = (iterator)&local_4d8;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4e8,
             msg_08);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  bVar2 = EquivalentResult((SelectionResult *)local_1c8,pTVar4);
  local_1e8._M_dataplus._M_p._0_1_ = bVar2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_460._0_8_ = "EquivalentResult(expected_result, *res)";
  local_460.m_message.px = (element_type *)0xf80603;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4f0 = "";
  puVar7 = (unsigned_long *)0x1;
  pvVar6 = (iterator)0x0;
  aStack_148._8_8_ = &local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_158,1,0,WARN,(check_type)m_node,
             (size_t)&local_4f8,0x4d4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  local_3c0 = 0x5c;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x4d7;
  file_09.m_begin = (iterator)&local_508;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = (iterator)puVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_518,
             msg_09);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  sVar5 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar5 == local_3c0);
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  local_468 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  tinyformat::format<unsigned_long,unsigned_long>
            (&local_1e8,(tinyformat *)"Expected %i attempts, but got %i",(char *)&local_3c0,
             &local_468,puVar7);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013aba30;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_520 = "";
  aStack_148._8_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_158,1,1,WARN,(check_type)m_node,(size_t)&local_528,
             0x4d7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_1c8);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  local_248 = 989999999;
  p_Var8 = &local_548;
  local_548._M_unused._M_object = (void *)0x0;
  local_548._8_8_ = 0;
  local_530 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1248:91)>
              ::_M_invoke;
  local_538 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1248:91)>
              ::_M_manager;
  pvVar6 = (iterator)0x61a80;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_248,&local_240,m_node,
              400000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_538 != (code *)0x0) {
    (*local_538)(&local_548,&local_548,__destroy_functor);
  }
  local_1c8._8_4_ = _S_red;
  local_1c8._16_8_ = 0;
  local_1a0 = 0;
  aStack_198._M_allocated_capacity = 0;
  aStack_198._8_2_ = 3;
  local_180 = false;
  local_178 = true;
  local_168 = 0;
  local_160 = 0;
  local_158._0_8_ = (_func_int **)0x17d78400;
  local_1c8._24_8_ = pcVar1;
  local_1a8._M_p = pcVar1;
  add_coin((CAmount *)local_158,0,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0x11e1a300;
  add_coin((CAmount *)local_158,0,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0xbebc200;
  add_coin((CAmount *)local_158,0,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0x5f5e100;
  add_coin((CAmount *)local_158,0,(SelectionResult *)local_1c8);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x4fb;
  file_10.m_begin = (iterator)&local_558;
  msg_10.m_end = (iterator)p_Var8;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_568,
             msg_10);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  bVar2 = EquivalentResult((SelectionResult *)local_1c8,pTVar4);
  local_1e8._M_dataplus._M_p._0_1_ = bVar2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_460._0_8_ = "EquivalentResult(expected_result, *res)";
  local_460.m_message.px = (element_type *)0xf80603;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_570 = "";
  puVar7 = (unsigned_long *)0x1;
  pvVar6 = (iterator)0x0;
  aStack_148._8_8_ = &local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_158,1,0,WARN,(check_type)m_node,
             (size_t)&local_578,0x4fb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  local_3c0 = 0x26;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x4fe;
  file_11.m_begin = (iterator)&local_588;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = (iterator)puVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_598,
             msg_11);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  sVar5 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar5 == local_3c0);
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  local_468 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  tinyformat::format<unsigned_long,unsigned_long>
            (&local_1e8,(tinyformat *)"Expected %i attempts, but got %i",(char *)&local_3c0,
             &local_468,puVar7);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013aba30;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_5a0 = "";
  aStack_148._8_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_158,1,1,WARN,(check_type)m_node,(size_t)&local_5a8,
             0x4fe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_1c8);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  local_248 = 190000000;
  p_Var8 = &local_5c8;
  local_5c8._M_unused._M_object = (void *)0x0;
  local_5c8._8_8_ = 0;
  local_5b0 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1287:91)>
              ::_M_invoke;
  local_5b8 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1287:91)>
              ::_M_manager;
  pvVar6 = (iterator)0x9c40;
  CoinGrinder((Result<wallet::SelectionResult> *)&local_138,(CAmount *)&local_248,&local_240,m_node,
              40000,(function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var8);
  if (local_5b8 != (code *)0x0) {
    (*local_5b8)(&local_5c8,&local_5c8,__destroy_functor);
  }
  local_1c8._8_4_ = _S_red;
  local_1c8._16_8_ = 0;
  local_1a0 = 0;
  aStack_198._M_allocated_capacity = 0;
  aStack_198._8_2_ = 3;
  local_180 = false;
  local_178 = true;
  local_168 = 0;
  local_160 = 0;
  local_158._0_8_ = (_func_int **)0x5f5e100;
  local_1c8._24_8_ = pcVar1;
  local_1a8._M_p = pcVar1;
  add_coin((CAmount *)local_158,1,(SelectionResult *)local_1c8);
  local_158._0_8_ = (_func_int **)0x5f5e100;
  add_coin((CAmount *)local_158,2,(SelectionResult *)local_1c8);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x515;
  file_12.m_begin = (iterator)&local_5d8;
  msg_12.m_end = (iterator)p_Var8;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_5e8,
             msg_12);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  bVar2 = EquivalentResult((SelectionResult *)local_1c8,pTVar4);
  local_1e8._M_dataplus._M_p._0_1_ = bVar2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_460._0_8_ = "EquivalentResult(expected_result, *res)";
  local_460.m_message.px = (element_type *)0xf80603;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_5f0 = "";
  puVar7 = (unsigned_long *)0x1;
  pvVar6 = (iterator)0x0;
  aStack_148._8_8_ = &local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)local_158,1,0,WARN,(check_type)m_node,
             (size_t)&local_5f8,0x515);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  local_3c0 = 7;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x518;
  file_13.m_begin = (iterator)&local_608;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = (iterator)puVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_618,
             msg_13);
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  sVar5 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  local_460.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar5 == local_3c0);
  local_460.m_message.px = (element_type *)0x0;
  local_460.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pTVar4 = util::Result<wallet::SelectionResult>::value
                     ((Result<wallet::SelectionResult> *)&local_138);
  local_468 = SelectionResult::GetSelectionsEvaluated(pTVar4);
  tinyformat::format<unsigned_long,unsigned_long>
            (&local_1e8,(tinyformat *)"Expected %i attempts, but got %i",(char *)&local_3c0,
             &local_468,puVar7);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013aba30;
  aStack_148._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_620 = "";
  aStack_148._8_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_460,(lazy_ostream *)local_158,1,1,WARN,(check_type)m_node,(size_t)&local_628,
             0x518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_460.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_1c8);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_138);
  ChaCha20::~ChaCha20(&local_c0.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(coin_grinder_tests)
{
    // Test Coin Grinder:
    // 1) Insufficient funds, select all provided coins and fail.
    // 2) Exceeded max weight, coin selection always surpasses the max allowed weight.
    // 3) Select coins without surpassing the max weight (some coins surpasses the max allowed weight, some others not)
    // 4) Test that two less valuable UTXOs with a combined lower weight are preferred over a more valuable heavier UTXO
    // 5) Test finding a solution in a UTXO pool with mixed weights
    // 6) Test that the lightest solution among many clones is found
    // 7) Test that lots of tiny UTXOs can be skipped if they are too heavy while there are enough funds in lookahead

    FastRandomContext rand;
    CoinSelectionParams dummy_params{ // Only used to provide the 'avoid_partial' flag.
            rand,
            /*change_output_size=*/34,
            /*change_spend_size=*/68,
            /*min_change_target=*/CENT,
            /*effective_feerate=*/CFeeRate(5000),
            /*long_term_feerate=*/CFeeRate(2000),
            /*discard_feerate=*/CFeeRate(1000),
            /*tx_noinputs_size=*/10 + 34, // static header size + output size
            /*avoid_partial=*/false,
    };

    {
        // #########################################################
        // 1) Insufficient funds, select all provided coins and fail
        // #########################################################
        CAmount target = 49.5L * COIN;
        int max_selection_weight = 10'000; // high enough to not fail for this reason.
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN));
                add_coin(available_coins, wallet, CAmount(2 * COIN));
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).empty()); // empty means "insufficient funds"
    }

    {
        // ###########################
        // 2) Test max weight exceeded
        // ###########################
        CAmount target = 29.5L * COIN;
        int max_selection_weight = 3000;
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true);
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).original.find("The inputs size exceeds the maximum weight") != std::string::npos);
    }

    {
        // ###############################################################################################################
        // 3) Test selection when some coins surpass the max allowed weight while others not. --> must find a good solution
        // ################################################################################################################
        CAmount target = 25.33L * COIN;
        int max_selection_weight = 10'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 60; ++j) { // 60 UTXO --> 19,8 BTC total --> 60 × 272 WU = 16320 WU
                add_coin(available_coins, wallet, CAmount(0.33 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            for (int i = 0; i < 10; i++) { // 10 UTXO --> 20 BTC total --> 10 × 272 WU = 2720 WU
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 37;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 4) Test that two less valuable UTXOs with a combined lower weight are preferred over a more valuable heavier UTXO
        // #################################################################################################################
        CAmount target =  1.9L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true, 148);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 68);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 68);
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(1 * COIN, 1, expected_result);
        add_coin(1 * COIN, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 3;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // ###############################################################################################################
        // 5) Test finding a solution in a UTXO pool with mixed weights
        // ################################################################################################################
        CAmount target = 30L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 5; ++j) {
                // Add heavy coins {3, 6, 9, 12, 15}
                add_coin(available_coins, wallet, CAmount((3 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 350);
                // Add medium coins {2, 5, 8, 11, 14}
                add_coin(available_coins, wallet, CAmount((2 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 250);
                // Add light coins {1, 4, 7, 10, 13}
                add_coin(available_coins, wallet, CAmount((1 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 150);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(14 * COIN, 1, expected_result);
        add_coin(13 * COIN, 2, expected_result);
        add_coin(4 * COIN, 3, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 92;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 6) Test that the lightest solution among many clones is found
        // #################################################################################################################
        CAmount target =  9.9L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            // Expected Result: 4 + 3 + 2 + 1 = 10 BTC at 400 vB
            add_coin(available_coins, wallet, CAmount(4 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(3 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            // Distracting clones:
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(8 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(7 * COIN), CFeeRate(5000), 144, false, 0, true, 800);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(6 * COIN), CFeeRate(5000), 144, false, 0, true, 600);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(5 * COIN), CFeeRate(5000), 144, false, 0, true, 400);
            }
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(4 * COIN, 0, expected_result);
        add_coin(3 * COIN, 0, expected_result);
        add_coin(2 * COIN, 0, expected_result);
        add_coin(1 * COIN, 0, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 38;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 7) Test that lots of tiny UTXOs can be skipped if they are too heavy while there are enough funds in lookahead
        // #################################################################################################################
        CAmount target =  1.9L * COIN;
        int max_selection_weight = 40000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            add_coin(available_coins, wallet, CAmount(1.8 * COIN), CFeeRate(5000), 144, false, 0, true, 2500);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            for (int j = 0; j < 100; ++j) {
                // make a 100 unique coins only differing by one sat
                add_coin(available_coins, wallet, CAmount(0.01 * COIN + j), CFeeRate(5000), 144, false, 0, true, 110);
            }
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(1 * COIN, 1, expected_result);
        add_coin(1 * COIN, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 7;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }
}